

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::finish(cb_adf *data)

{
  label *plVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
            (&(data->gen_cs).mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>);
  v_array<CB::label>::delete_v(&data->cb_labels);
  lVar3 = 0;
  for (uVar2 = 0; plVar1 = (data->prepped_cs_labels)._begin,
      uVar2 < (ulong)((long)(data->prepped_cs_labels)._end - (long)plVar1 >> 5); uVar2 = uVar2 + 1)
  {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)((long)&(plVar1->costs)._begin + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  v_array<COST_SENSITIVE::label>::delete_v(&data->prepped_cs_labels);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(data->cs_labels).costs);
  v_array<unsigned_int>::delete_v(&data->backup_weights);
  v_array<unsigned_int>::delete_v(&data->backup_nf);
  v_array<ACTION_SCORE::action_score>::delete_v(&data->prob_s);
  v_array<ACTION_SCORE::action_score>::delete_v(&data->a_s);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(data->gen_cs).pred_scores.costs);
  return;
}

Assistant:

void finish(cb_adf& data)
{
  data.gen_cs.mtr_ec_seq.~multi_ex();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.cs_labels.costs.delete_v();
  data.backup_weights.delete_v();
  data.backup_nf.delete_v();
  data.prob_s.delete_v();

  data.a_s.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
}